

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

bool __thiscall MeCab::anon_unknown_0::LatticeImpl::next(LatticeImpl *this)

{
  bool bVar1;
  ulong uVar2;
  long *in_RDI;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_00000010;
  NBestGenerator *in_stack_00000018;
  bool local_1;
  
  uVar2 = (**(code **)(*in_RDI + 0x90))(in_RDI,2);
  if ((uVar2 & 1) == 0) {
    (**(code **)(*in_RDI + 0x128))(in_RDI,"MECAB_NBEST request type is not set");
    local_1 = false;
  }
  else {
    (**(code **)(*in_RDI + 0xb0))();
    Allocator<mecab_node_t,_mecab_path_t>::nbest_generator(in_stack_00000010);
    bVar1 = NBestGenerator::next(in_stack_00000018);
    if (bVar1) {
      Viterbi::buildResultForNBest((Lattice *)0x1a2d40);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool LatticeImpl::next() {
  if (!has_request_type(MECAB_NBEST)) {
    set_what("MECAB_NBEST request type is not set");
    return false;
  }

  if (!allocator()->nbest_generator()->next()) {
    return false;
  }

  Viterbi::buildResultForNBest(this);
  return true;
}